

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O1

Port * __thiscall Vault::Client::getPort_abi_cxx11_(Port *__return_storage_ptr__,Client *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  pcVar1 = (this->port_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->port_).value_._M_string_length)
  ;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Port getPort() const { return port_; }